

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

int fft_segment_fwd(mixed_segment *segment)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  float *pSrc;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __y;
  double dVar9;
  undefined4 in_stack_ffffffffffffff38;
  uint size;
  uint32_t out_samples;
  long fifo_latency;
  double expected;
  double bin_frequencies;
  long step;
  long framesize2;
  long qpd;
  long k;
  long i;
  double imag;
  double real;
  double window;
  double tmp;
  double phase;
  double magnitude;
  float *pfStack_48;
  uint32_t in_samples;
  float *out;
  float *in;
  float *last_phase;
  float *fft_workspace;
  float *in_fifo;
  uint32_t oversampling;
  uint32_t framesize;
  fft_segment_data *data;
  mixed_segment *segment_local;
  
  _oversampling = (undefined8 *)segment->data;
  in_fifo._4_4_ = *(uint *)((long)_oversampling + 0x14);
  in_fifo._0_4_ = *(uint *)(_oversampling + 3);
  fft_workspace = (float *)_oversampling[5];
  last_phase = (float *)_oversampling[6];
  in = (float *)_oversampling[7];
  magnitude._4_4_ = 0xffffffff;
  data = (fft_segment_data *)segment;
  mixed_buffer_request_read(&out,(uint32_t *)((long)&magnitude + 4),(mixed_buffer *)*_oversampling);
  uVar3 = in_fifo._4_4_ >> 1;
  uVar2 = (ulong)in_fifo._4_4_ / (ulong)(uint)in_fifo;
  dVar6 = (double)*(uint *)(_oversampling + 2) / (double)in_fifo._4_4_;
  dVar7 = ((double)uVar2 * 6.283185307179586) / (double)in_fifo._4_4_;
  pSrc = (float *)(in_fifo._4_4_ - uVar2);
  if (_oversampling[4] == 0) {
    _oversampling[4] = pSrc;
  }
  for (k = 0; k < (long)(ulong)magnitude._4_4_; k = k + 1) {
    fft_workspace[_oversampling[4]] = out[k];
    _oversampling[4] = _oversampling[4] + 1;
    if ((long)(ulong)in_fifo._4_4_ <= (long)_oversampling[4]) {
      size = in_fifo._4_4_;
      mixed_buffer_clear((mixed_buffer *)_oversampling[1]);
      mixed_buffer_request_write
                (&stack0xffffffffffffffb8,(uint32_t *)&stack0xffffffffffffff3c,
                 (mixed_buffer *)_oversampling[1]);
      _oversampling[4] = pSrc;
      for (qpd = 0; qpd < (long)(ulong)in_fifo._4_4_; qpd = qpd + 1) {
        dVar8 = cos(((double)qpd * 6.283185307179586) / (double)in_fifo._4_4_);
        last_phase[qpd * 2] = (float)((double)fft_workspace[qpd] * (dVar8 * -0.5 + 0.5));
        last_phase[qpd * 2 + 1] = 0.0;
      }
      expected._0_4_ = SUB84(dVar6,0);
      fifo_latency._4_4_ = (int)((ulong)dVar7 >> 0x20);
      spiral_fft_float(expected._0_4_,fifo_latency._4_4_,pSrc,
                       (float *)CONCAT44(size,in_stack_ffffffffffffff38));
      for (qpd = 0; qpd <= (long)(ulong)uVar3; qpd = qpd + 1) {
        dVar8 = (double)last_phase[qpd * 2];
        __y = (double)last_phase[qpd * 2 + 1];
        dVar9 = sqrt(dVar8 * dVar8 + __y * __y);
        dVar8 = atan2(__y,dVar8);
        fVar1 = in[qpd];
        in[qpd] = (float)dVar8;
        dVar8 = -(double)qpd * dVar7 + (dVar8 - (double)fVar1);
        uVar4 = (ulong)(dVar8 / 3.141592653589793);
        if ((long)uVar4 < 0) {
          uVar5 = -(uVar4 & 1);
        }
        else {
          uVar5 = uVar4 & 1;
        }
        framesize2 = uVar5 + uVar4;
        pfStack_48[qpd * 2] =
             (float)((double)qpd * dVar6 +
                    (((double)(uint)in_fifo * ((double)framesize2 * -3.141592653589793 + dVar8)) /
                    6.283185307179586) * dVar6);
        pfStack_48[qpd * 2 + 1] = (float)(dVar9 * 2.0);
      }
      mixed_buffer_finish_write(size,(mixed_buffer *)_oversampling[1]);
      for (qpd = 0; qpd < (long)pSrc; qpd = qpd + 1) {
        fft_workspace[qpd] = fft_workspace[qpd + uVar2];
      }
    }
  }
  mixed_buffer_finish_read(magnitude._4_4_,(mixed_buffer *)*_oversampling);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}